

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_prior_to_ops(bool walflush)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar8;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  fdb_commit_opt_t opt;
  long lVar9;
  ulong uVar10;
  fdb_kvs_handle *pfVar11;
  code *pcVar12;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar16;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar19;
  uint uVar20;
  undefined7 in_register_00000039;
  fdb_file_handle *pfVar21;
  fdb_doc **ppfVar22;
  fdb_kvs_handle **ppfVar23;
  ulong uVar24;
  btree *doc;
  uint uVar25;
  uint64_t *doc_00;
  long lVar26;
  char *pcVar27;
  fdb_kvs_config *config;
  char *pcVar28;
  uint *puVar29;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar30;
  char *pcVar31;
  kvs_ops_stat *pkVar32;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar33;
  fdb_doc **ppfVar34;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_01;
  fdb_kvs_handle *pfVar35;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *mirror_kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *vdoc;
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  timeval __test_begin;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStack_5cf0;
  fdb_kvs_handle *pfStack_5ce8;
  fdb_file_handle *pfStack_5ce0;
  fdb_iterator *pfStack_5cd8;
  fdb_doc *pfStack_5cd0;
  fdb_kvs_handle *pfStack_5cc8;
  timeval tStack_5cc0;
  fdb_kvs_config fStack_5cb0;
  fdb_config fStack_5c98;
  fdb_config *pfStack_5ba0;
  fdb_kvs_handle *pfStack_5b98;
  fdb_kvs_handle *pfStack_5b90;
  fdb_file_handle *pfStack_5b88;
  fdb_kvs_handle *pfStack_5b80;
  char acStack_5b77 [15];
  filemgr *pfStack_5b68;
  docio_handle *pdStack_5b60;
  btreeblk_handle *pbStack_5b58;
  size_t sStack_5b50;
  filemgr *pfStack_5b48;
  docio_handle *pdStack_5b40;
  btreeblk_handle *pbStack_5b38;
  timeval tStack_5b30;
  undefined1 auStack_5b20 [76];
  uint uStack_5ad4;
  char *pcStack_59e0;
  atomic<unsigned_long> aStack_59d8;
  btree *pbStack_59d0;
  fdb_kvs_handle *pfStack_59c8;
  fdb_kvs_handle *pfStack_59c0;
  code *pcStack_59b8;
  uint uStack_59a4;
  fdb_txn *pfStack_59a0;
  fdb_kvs_handle *pfStack_5998;
  fdb_iterator *pfStack_5990;
  fdb_snapshot_info_t *pfStack_5988;
  int iStack_597c;
  fdb_kvs_handle *pfStack_5978;
  fdb_kvs_handle *apfStack_5970 [3];
  uint64_t uStack_5958;
  fdb_kvs_config fStack_5950;
  char acStack_5938 [8];
  timeval tStack_5930;
  char acStack_5920 [256];
  btree bStack_5820;
  char acStack_57d0 [256];
  char acStack_56d0 [256];
  fdb_config fStack_55d0;
  fdb_kvs_handle **ppfStack_54d8;
  fdb_kvs_handle **ppfStack_54d0;
  fdb_kvs_handle *pfStack_54c8;
  fdb_kvs_handle **ppfStack_54c0;
  fdb_kvs_handle *pfStack_54b8;
  code *pcStack_54b0;
  fdb_kvs_handle **ppfStack_54a8;
  fdb_kvs_handle *pfStack_54a0;
  fdb_kvs_handle *apfStack_5498 [9];
  fdb_kvs_config fStack_5450;
  timeval tStack_5438;
  fdb_kvs_handle *apfStack_5428 [33];
  fdb_config fStack_5320;
  fdb_kvs_handle *apfStack_5228 [32];
  fdb_kvs_handle *apfStack_5128 [32];
  fdb_kvs_handle afStack_5028 [15];
  fdb_config *pfStack_3020;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3018;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3010;
  fdb_config *pfStack_3008;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3000;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2ff8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2fe8;
  fdb_file_handle *pfStack_2fe0;
  fdb_iterator *pfStack_2fd8;
  fdb_doc *pfStack_2fd0;
  fdb_kvs_handle *pfStack_2fc8;
  undefined1 auStack_2fbf [15];
  timeval tStack_2fb0;
  undefined1 auStack_2fa0 [72];
  fdb_config fStack_2f58;
  timeval *ptStack_2e60;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e50;
  fdb_config *pfStack_2e48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e30;
  fdb_file_handle *pfStack_2e28;
  undefined4 uStack_2e1c;
  pthread_t pStack_2e18;
  char acStack_2e0f [15];
  void *pvStack_2e00;
  char *pcStack_2df8;
  fdb_config *pfStack_2df0;
  uint64_t uStack_2de8;
  timeval tStack_2de0;
  undefined1 auStack_2dd0 [16];
  uint64_t uStack_2dc0;
  fdb_config fStack_2cd8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bd8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bd0;
  uint *puStack_2bc8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bc0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bb8;
  timeval tStack_2ba8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b98;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b90;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b80;
  fdb_kvs_handle *pfStack_2b78;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b70;
  fdb_file_handle *pfStack_2b68;
  uint uStack_2b5c;
  fdb_kvs_config afStack_2b58 [2];
  timeval tStack_2b18;
  fdb_kvs_config fStack_2b08;
  fdb_kvs_info fStack_2ae8;
  undefined1 auStack_2ab8 [32];
  undefined1 uStack_2a98;
  undefined1 uStack_2a8a;
  undefined8 uStack_2a80;
  code *pcStack_2a60;
  undefined4 uStack_2a58;
  uint *puStack_2a50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29b0;
  hbtrie_func_readkey *phStack_29a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2998;
  fdb_file_handle *pfStack_2988;
  int iStack_297c;
  fdb_kvs_handle *pfStack_2978;
  fdb_kvs_handle *pfStack_2970;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2968;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2960 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2938;
  char acStack_2930 [8];
  fdb_kvs_config fStack_2928;
  fdb_kvs_info fStack_2910;
  timeval tStack_28e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_28d0 [5];
  btree *apbStack_28a8 [5];
  btree *apbStack_2880 [5];
  btree *apbStack_2858 [4];
  fdb_doc *pfStack_2838;
  char acStack_2830 [256];
  char acStack_2730 [256];
  char acStack_2630 [256];
  fdb_config fStack_2530;
  fdb_doc *pfStack_2438;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2430;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2428;
  fdb_kvs_config *pfStack_2420;
  fdb_doc **ppfStack_2418;
  code *pcStack_2410;
  undefined1 auStack_23f8 [72];
  fdb_kvs_config fStack_23b0;
  fdb_doc afStack_2398 [3];
  char acStack_2298 [256];
  char acStack_2198 [264];
  fdb_config fStack_2090;
  fdb_doc *pfStack_1f98;
  size_t *psStack_1f90;
  fdb_doc *apfStack_1ae8 [151];
  fdb_kvs_handle *pfStack_1630;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1628;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1620;
  char *pcStack_1618;
  char *pcStack_1610;
  code *pcStack_1608;
  fdb_kvs_handle *pfStack_15f8;
  int iStack_15ec;
  fdb_kvs_handle *pfStack_15e8;
  undefined1 auStack_15e0 [232];
  char acStack_14f8 [8];
  char acStack_14f0 [64];
  timeval tStack_14b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_14a0 [5];
  btree *apbStack_1478 [5];
  btree *apbStack_1450 [5];
  btree *apbStack_1428 [5];
  fdb_config fStack_1400;
  fdb_kvs_info *pfStack_1308;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1300;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_12f8;
  fdb_kvs_handle **ppfStack_12f0;
  fdb_kvs_handle **ppfStack_12e8;
  code *pcStack_12e0;
  fdb_file_handle *pfStack_12c8;
  uint uStack_12bc;
  fdb_kvs_handle *apfStack_12b8 [4];
  fdb_kvs_info fStack_1298;
  fdb_kvs_config fStack_1268;
  char acStack_1250 [8];
  timeval tStack_1248;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1238 [5];
  btree *apbStack_1210 [5];
  btree *apbStack_11e8 [5];
  btree *apbStack_11c0 [5];
  char acStack_1198 [256];
  char acStack_1098 [256];
  char acStack_f98 [256];
  fdb_config fStack_e98;
  fdb_kvs_handle *pfStack_da0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d98;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d90;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d88;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d80;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d78;
  uint uStack_d64;
  uint uStack_d60;
  uint uStack_d5c;
  fdb_kvs_handle *pfStack_d58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d50;
  long lStack_d48;
  fdb_kvs_handle *pfStack_d40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d38;
  size_t sStack_d30;
  fdb_kvs_handle *pfStack_d28;
  timeval tStack_d20;
  fdb_kvs_handle fStack_d10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad8;
  char *pcStack_ad0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac8;
  code *pcStack_ab0;
  undefined1 auStack_aa8 [104];
  fdb_kvs_config fStack_a40;
  fdb_config fStack_a28;
  char acStack_930 [256];
  kvs_info akStack_830 [11];
  ulong uStack_728;
  char *pcStack_720;
  fdb_doc **ppfStack_718;
  uint64_t *puStack_710;
  fdb_kvs_info *pfStack_708;
  code *pcStack_700;
  fdb_kvs_handle *local_6f0;
  fdb_kvs_handle *local_6e8;
  fdb_doc *local_6e0;
  fdb_file_handle *local_6d8;
  fdb_iterator *local_6d0;
  uint local_6c4;
  undefined1 local_6c0 [40];
  fdb_kvs_info local_698;
  timeval local_668;
  fdb_doc *local_658 [100];
  char local_338 [264];
  fdb_config local_230;
  char local_138 [264];
  
  pcStack_700 = (code *)0x119521;
  gettimeofday(&local_668,(__timezone_ptr_t)0x0);
  pcStack_700 = (code *)0x119526;
  memleak_start();
  pcStack_700 = (code *)0x119536;
  fdb_get_default_config();
  pcStack_700 = (code *)0x119543;
  fdb_get_default_kvs_config();
  local_6e0 = (fdb_doc *)0x0;
  pcStack_700 = (code *)0x119558;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 0x400;
  local_230.seqtree_opt = '\x01';
  local_230.flags = 1;
  local_230.compaction_threshold = '\n';
  local_230.purging_interval = 1;
  pcStack_700 = (code *)0x11958e;
  fdb_open(&local_6d8,"./mvcc_test1",&local_230);
  pcStack_700 = (code *)0x1195a6;
  fdb_kvs_open(local_6d8,&local_6f0,"kv1",(fdb_kvs_config *)(local_6c0 + 0x10));
  local_6c4 = (uint)CONCAT71(in_register_00000039,walflush);
  if (local_6c4 == 0) {
    pcVar31 = "mirror";
  }
  else {
    pcVar31 = (char *)0x0;
  }
  pcStack_700 = (code *)0x1195d6;
  fdb_kvs_open(local_6d8,&local_6e8,pcVar31,(fdb_kvs_config *)(local_6c0 + 0x10));
  lVar9 = 0;
  uVar24 = 0;
  do {
    pcStack_700 = (code *)0x1195fa;
    sprintf(local_338,"key%d",uVar24 & 0xffffffff);
    pcStack_700 = (code *)0x11960d;
    sVar5 = strlen(local_338);
    pcStack_700 = (code *)0x11962b;
    fdb_doc_create((fdb_doc **)((long)local_658 + lVar9),local_338,sVar5,(void *)0x0,0,(void *)0x0,0
                  );
    pcStack_700 = (code *)0x11963d;
    fdb_set(local_6f0,local_658[uVar24]);
    pcStack_700 = (code *)0x11964f;
    fdb_set(local_6e8,local_658[uVar24]);
    uVar24 = uVar24 + 1;
    lVar9 = lVar9 + 8;
  } while (uVar24 != 100);
  lVar9 = 0;
  pcStack_700 = (code *)0x11966a;
  fdb_commit(local_6d8,'\0');
  do {
    pcStack_700 = (code *)0x11967c;
    fdb_del(local_6f0,local_658[lVar9]);
    pcStack_700 = (code *)0x11968e;
    fdb_del(local_6e8,local_658[lVar9]);
    pcStack_700 = (code *)0x11969b;
    fdb_doc_free(local_658[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x32);
  lVar9 = 0;
  do {
    pcStack_700 = (code *)0x1196b3;
    fdb_doc_free(local_658[lVar9 + 0x32]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x32);
  pcStack_700 = (code *)0x1196c8;
  fdb_commit(local_6d8,'\0');
  pcStack_700 = (code *)0x1196d7;
  fdb_get_kvs_info(local_6f0,&local_698);
  if (local_698.doc_count != 0x32) {
    pcStack_700 = (code *)0x1196e7;
    rollback_prior_to_ops();
  }
  local_6c0._8_8_ = local_698.last_seqnum;
  pcVar31 = "key%d";
  doc_00 = (uint64_t *)0x0;
  do {
    uVar24 = 100;
    lVar9 = 0;
    do {
      pcStack_700 = (code *)0x119719;
      sprintf(local_338,"key%d",uVar24);
      ppfVar34 = (fdb_doc **)((long)local_658 + lVar9);
      pcStack_700 = (code *)0x11972c;
      sVar5 = strlen(local_338);
      pcStack_700 = (code *)0x11974a;
      fdb_doc_create(ppfVar34,local_338,sVar5,(void *)0x0,0,(void *)0x0,0);
      pcStack_700 = (code *)0x119758;
      fdb_set(local_6f0,*ppfVar34);
      pcStack_700 = (code *)0x119766;
      fdb_del(local_6f0,*ppfVar34);
      pcStack_700 = (code *)0x11976f;
      fdb_doc_free(*ppfVar34);
      uVar24 = (ulong)((int)uVar24 + 1);
      lVar9 = lVar9 + 8;
    } while (lVar9 != 800);
    uVar25 = (int)doc_00 + 1;
    doc_00 = (uint64_t *)(ulong)uVar25;
  } while (uVar25 != 100);
  uVar10 = (ulong)local_6c4;
  opt = (fdb_commit_opt_t)local_6c4;
  pcStack_700 = (code *)0x11979c;
  fdb_commit(local_6d8,opt);
  pcStack_700 = (code *)0x1197ab;
  fVar2 = fdb_rollback(&local_6f0,(long)(int)local_6c0._8_4_);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_700 = (code *)0x1197c5;
    fdb_get_kvs_info(local_6f0,&local_698);
    doc_00 = &local_698.doc_count;
    if (local_698.doc_count != 0x32) {
      pcStack_700 = (code *)0x1197d9;
      rollback_prior_to_ops();
    }
    pcVar31 = (char *)&local_698;
    pcStack_700 = (code *)0x1197eb;
    fdb_get_kvs_info(local_6e8,(fdb_kvs_info *)pcVar31);
    if (local_698.doc_count != 0x32) {
      pcStack_700 = (code *)0x1197fa;
      rollback_prior_to_ops();
    }
    pcStack_700 = (code *)0x119810;
    fVar2 = fdb_iterator_sequence_init(local_6e8,&local_6d0,0,0,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      doc_00 = (uint64_t *)&local_6e0;
      pcVar31 = local_6c0;
      while( true ) {
        pcStack_700 = (code *)0x11982f;
        fVar2 = fdb_iterator_get_metaonly(local_6d0,(fdb_doc **)doc_00);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pcStack_700 = (code *)0x11985f;
        fdb_doc_create((fdb_doc **)pcVar31,local_6e0->key,local_6e0->keylen,local_6e0->meta,
                       local_6e0->metalen,local_6e0->body,local_6e0->bodylen);
        pcStack_700 = (code *)0x11986e;
        fVar2 = fdb_get(local_6f0,(fdb_doc *)local_6c0._0_8_);
        if (local_6e0->deleted == true) {
          if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011995e;
        }
        else if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119959;
        pcStack_700 = (code *)0x119890;
        fdb_doc_free(local_6e0);
        local_6e0 = (fdb_doc *)0x0;
        pcStack_700 = (code *)0x1198a3;
        fdb_doc_free((fdb_doc *)local_6c0._0_8_);
        pcStack_700 = (code *)0x1198ad;
        fVar2 = fdb_iterator_next(local_6d0);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_700 = (code *)0x1198c0;
          fdb_iterator_close(local_6d0);
          pcStack_700 = (code *)0x1198ca;
          fdb_kvs_close(local_6e8);
          pcStack_700 = (code *)0x1198d4;
          fdb_kvs_close(local_6f0);
          pcStack_700 = (code *)0x1198de;
          fdb_close(local_6d8);
          pcStack_700 = (code *)0x1198e3;
          fdb_shutdown();
          pcStack_700 = (code *)0x1198e8;
          memleak_end();
          pcVar31 = "normal commit:";
          if (opt != '\0') {
            pcVar31 = "commit with wal flush:";
          }
          pcStack_700 = (code *)0x119915;
          sprintf(local_138,"rollback prior to ops test %s",pcVar31);
          pcVar31 = "%s PASSED\n";
          if (rollback_prior_to_ops(bool)::__test_pass != '\0') {
            pcVar31 = "%s FAILED\n";
          }
          pcStack_700 = (code *)0x119942;
          fprintf(_stderr,pcVar31,local_138);
          return;
        }
      }
      pcStack_700 = (code *)0x119959;
      rollback_prior_to_ops();
LAB_00119959:
      pcStack_700 = (code *)0x11995e;
      rollback_prior_to_ops();
LAB_0011995e:
      pcStack_700 = (code *)0x119963;
      rollback_prior_to_ops();
      goto LAB_00119963;
    }
  }
  else {
LAB_00119963:
    pcStack_700 = (code *)0x119968;
    rollback_prior_to_ops();
  }
  pcStack_700 = snapshot_concurrent_compaction_test;
  rollback_prior_to_ops();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x11998a;
  uStack_728 = uVar10;
  pcStack_720 = local_338;
  ppfStack_718 = ppfVar34;
  puStack_710 = doc_00;
  pfStack_708 = (fdb_kvs_info *)pcVar31;
  pcStack_700 = (code *)uVar24;
  gettimeofday((timeval *)(auStack_aa8 + 0x58),(__timezone_ptr_t)0x0);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x11998f;
  memleak_start();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x11999c;
  fdb_get_default_config();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199a9;
  fdb_get_default_kvs_config();
  fStack_a28.compaction_cb_ctx = auStack_aa8 + 0x38;
  auStack_aa8._56_8_ = (btree *)0x0;
  auStack_aa8._64_8_ = (btree *)0x0;
  auStack_aa8._72_8_ = (filemgr *)0x0;
  fStack_a28.wal_threshold = 0x80;
  fStack_a28.flags = 1;
  fStack_a28.compaction_cb = cb_snapshot;
  fStack_a28.compaction_cb_mask = 0x11;
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199f2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a07;
  fdb_open((fdb_file_handle **)(auStack_aa8 + 0x28),"./mvcc_test1",&fStack_a28);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a21;
  fdb_kvs_open((fdb_file_handle *)auStack_aa8._40_8_,(fdb_kvs_handle **)(auStack_aa8 + 0x30),"db",
               &fStack_a40);
  auStack_aa8._56_8_ = auStack_aa8._48_8_;
  pkVar32 = (kvs_ops_stat *)CONCAT71((int7)((ulong)(auStack_aa8 + 0x28) >> 8),1);
  uVar24 = 0;
  do {
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a5a;
    sprintf((char *)akStack_830,"key%04d",uVar24);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a70;
    sprintf(acStack_930,"body%04d_update%d",uVar24,(ulong)(0x31 < (uint)uVar24));
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._48_8_;
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a7d;
    sVar5 = strlen((char *)akStack_830);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a89;
    sVar6 = strlen(acStack_930);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a9e;
    aVar8 = handle_00;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,akStack_830,(size_t)(sVar5 + 1),
                       acStack_930,sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b7d;
      snapshot_concurrent_compaction_test();
LAB_00119b7d:
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b82;
      snapshot_concurrent_compaction_test();
      goto LAB_00119b82;
    }
    if ((char)((char)(((uint)pkVar32 & 0xff) * 0x29 >> 0xb) * '2' + -1) == (char)uVar24) {
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119acd;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._40_8_;
      fVar2 = fdb_commit((fdb_file_handle *)auStack_aa8._40_8_,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119b7d;
    }
    uVar25 = (uint)uVar24 + 1;
    uVar24 = (ulong)uVar25;
    pkVar32 = (kvs_ops_stat *)CONCAT71((int7)((ulong)pkVar32 >> 8),(char)pkVar32 + '\x01');
  } while (uVar25 != 100);
  auStack_aa8._64_8_ = (btree *)0x200000064;
  auStack_aa8._72_4_ = 10;
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b0e;
  _snapshot_check((fdb_kvs_handle *)auStack_aa8._48_8_,100,2);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b1e;
  aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._40_8_;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_aa8._40_8_,"./mvcc_test2");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b2b;
    fdb_close((fdb_file_handle *)auStack_aa8._40_8_);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b30;
    fdb_shutdown();
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b35;
    memleak_end();
    pcVar31 = "%s PASSED\n";
    if (snapshot_concurrent_compaction_test()::__test_pass != '\0') {
      pcVar31 = "%s FAILED\n";
    }
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119b66;
    fprintf(_stderr,pcVar31,"snapshot with concurrent compaction test");
    return;
  }
LAB_00119b82:
  auStack_aa8._32_8_ = cb_snapshot;
  snapshot_concurrent_compaction_test();
  pfVar11 = (fdb_kvs_handle *)auStack_aa8;
  uVar10 = 0;
  pcStack_ab0 = (code *)0x119ba5;
  auStack_aa8._16_8_ = (void *)(sVar5 + 1);
  auStack_aa8._24_8_ = akStack_830;
  auStack_aa8._32_8_ = pkVar32;
  gettimeofday((timeval *)auStack_aa8,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)(auStack_aa8._48_8_ + 0x10);
  *(int *)(auStack_aa8._48_8_ + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return;
  }
  if (extraout_RDX == 0) {
    pcStack_ab0 = (code *)0x119bc5;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_aa8._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_aa8._48_8_ + 8),
                    *(int *)((long)(auStack_aa8._48_8_ + 8) + 4));
    pcStack_ab0 = (code *)0x119bd0;
    _snapshot_update_docs((fdb_file_handle *)aVar8.seqtree,(cb_snapshot_args *)auStack_aa8._48_8_);
    pcStack_ab0 = (code *)0x119bde;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_aa8._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_aa8._48_8_ + 8),
                    *(int *)((long)(auStack_aa8._48_8_ + 8) + 4));
    return;
  }
  pcStack_ab0 = _snapshot_check;
  cb_snapshot();
  aStack_ac8.seqtree = handle_00.seqtree;
  aStack_ad8.seqtree = (btree *)auStack_aa8._48_8_;
  paVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c17;
  pcStack_ad0 = acStack_930;
  pcStack_ab0 = (code *)uVar24;
  gettimeofday(&tStack_d20,(__timezone_ptr_t)0x0);
  uStack_d64 = (uint)uVar10;
  uVar25 = (int)(((uint)(uVar10 >> 0x1f) & 1) + uStack_d64) >> 1;
  paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar25;
  pfVar35 = &fStack_d10;
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c39;
  pfStack_d40 = pfVar11;
  fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)pfVar35);
  lStack_d48 = (long)(int)uVar25;
  if (fStack_d10.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((int)extraout_EDX * lStack_d48))
  {
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119db5;
    _snapshot_check();
  }
  paStack_d50 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_d50 = paVar13;
  }
  aVar8.seqtree = (btree *)0x0;
  while( true ) {
    paVar33 = paStack_d50;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree == paStack_d50) {
      return;
    }
    aStack_d38.seqtree = (btree *)&(aVar8.seqtree)->vsize;
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c89;
    pfVar11 = pfStack_d40;
    fVar2 = fdb_snapshot_open(pfStack_d40,&pfStack_d58,(long)aStack_d38.seqtree * lStack_d48);
    uVar20 = (uint)pfVar11;
    pfVar11 = pfVar35;
    __s = paVar15;
    paStack_d88 = paVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_d64) {
      uStack_d60 = aVar8._0_4_;
      uStack_d5c = (uStack_d60 - ((int)(uStack_d60 - 1) >> 0x1f)) - 1 | 1;
      uStack_d60 = uStack_d60 & 0x7ffffffe;
      paVar33 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar33;
        if ((int)uVar25 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar20 = uStack_d5c;
        if (iVar4 < (int)uVar25) {
          uVar20 = uStack_d60;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_d10.config.min_block_reuse_filesize;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119cfe;
        sprintf((char *)__s,"key%04d",paVar33);
        handle_00.seqtree = (btree *)&fStack_d10.trie;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d1c;
        sprintf((char *)handle_00.seqtree,"body%04d_update%d",paVar33,(ulong)uVar20);
        pfVar11 = pfStack_d58;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d29;
        sVar5 = strlen((char *)__s);
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d42;
        fVar2 = fdb_get_kv(pfVar11,__s,sVar5 + 1,&pfStack_d28,&sStack_d30);
        pfVar35 = pfStack_d28;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dbf;
          _snapshot_check();
LAB_00119dbf:
          uVar20 = (int)&fStack_d10 + 0x30;
          paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dcf;
          _snapshot_check();
          paStack_d88 = paVar15;
          goto LAB_00119dcf;
        }
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d5b;
        iVar3 = bcmp(pfStack_d28,handle_00.seqtree,sStack_d30);
        pfVar11 = pfVar35;
        if (iVar3 != 0) goto LAB_00119dbf;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d67;
        fdb_free_block(pfVar35);
        paVar33 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar13 = paVar15;
      } while (uStack_d64 != iVar4 + 1U);
    }
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d82;
    fVar2 = fdb_kvs_close(pfStack_d58);
    aVar8 = aStack_d38;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d99;
      _snapshot_check();
      return;
    }
  }
LAB_00119dcf:
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_12e0 = (code *)0x119df6;
  pfStack_da0 = pfVar11;
  aStack_d98 = aVar8;
  aStack_d90 = handle_00;
  paStack_d80 = paVar33;
  paStack_d78 = __s;
  gettimeofday((timeval *)(acStack_1250 + 8),(__timezone_ptr_t)0x0);
  pcStack_12e0 = (code *)0x119dfb;
  memleak_start();
  pcStack_12e0 = (code *)0x119e07;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_12e0 = (code *)0x119e17;
  fdb_get_default_config();
  pcStack_12e0 = (code *)0x119e21;
  fdb_get_default_kvs_config();
  fStack_e98.buffercache_size = 0;
  fStack_e98.wal_threshold = 0x400;
  fStack_e98.flags = 1;
  fStack_e98.compaction_threshold = '\0';
  pcStack_12e0 = (code *)0x119e54;
  fStack_e98.multi_kv_instances = (bool)(char)uVar20;
  fdb_open(&pfStack_12c8,"./mvcc_test1",&fStack_e98);
  uStack_12bc = uVar20;
  if (uVar20 == 0) {
    pcStack_12e0 = (code *)0x119ec3;
    fdb_kvs_open_default(pfStack_12c8,apfStack_12b8,&fStack_1268);
    lVar9 = 1;
  }
  else {
    ppfVar14 = apfStack_12b8;
    aVar8.seqtree = (btree *)&fStack_1268;
    uVar24 = 0;
    do {
      pcStack_12e0 = (code *)0x119e88;
      sprintf(acStack_1250,"kv%d",uVar24 & 0xffffffff);
      pcStack_12e0 = (code *)0x119e9b;
      fdb_kvs_open(pfStack_12c8,ppfVar14,acStack_1250,(fdb_kvs_config *)aVar8.seqtree);
      uVar24 = uVar24 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar24 != 4);
    lVar9 = 4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar14 = (fdb_kvs_handle **)0x0;
  pcVar12 = logCallbackFunc;
  pcVar31 = "rollback_to_zero_test";
  do {
    pfVar11 = apfStack_12b8[(long)ppfVar14];
    pcStack_12e0 = (code *)0x119ee9;
    fVar2 = fdb_set_log_callback(pfVar11,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_12e0 = (code *)0x11a472;
      rollback_to_zero_test();
      goto LAB_0011a472;
    }
    ppfVar14 = (fdb_kvs_handle **)((long)ppfVar14 + 1);
  } while ((fdb_kvs_handle **)lVar9 != ppfVar14);
  uVar24 = 0;
  do {
    pcStack_12e0 = (code *)0x119f18;
    sprintf(acStack_1098,"key%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x119f34;
    sprintf(acStack_1198,"meta%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x119f50;
    sprintf(acStack_f98,"body%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x119f63;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x119f6e;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x119f79;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x119f9e;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar24].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar26 = 0;
    do {
      pcStack_12e0 = (code *)0x119fae;
      fdb_set(apfStack_12b8[lVar26],(fdb_doc *)aaStack_1238[uVar24].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar9 != lVar26);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  pcStack_12e0 = (code *)0x119fd2;
  fdb_commit(pfStack_12c8,'\x01');
  uVar24 = 5;
  do {
    pcStack_12e0 = (code *)0x119ff4;
    sprintf(acStack_1098,"key%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a010;
    sprintf(acStack_1198,"meta%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a02c;
    sprintf(acStack_f98,"body%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a03f;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x11a04a;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x11a055;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x11a07a;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar24].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar26 = 0;
    do {
      pcStack_12e0 = (code *)0x11a08b;
      fdb_set(apfStack_12b8[lVar26],(fdb_doc *)aaStack_1238[uVar24].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar9 != lVar26);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 10);
  pcStack_12e0 = (code *)0x11a0ac;
  fdb_commit(pfStack_12c8,'\0');
  uVar24 = 10;
  do {
    pcStack_12e0 = (code *)0x11a0ce;
    sprintf(acStack_1098,"key%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a0ea;
    sprintf(acStack_1198,"meta%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a106;
    sprintf(acStack_f98,"body%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a119;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x11a124;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x11a12f;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x11a154;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar24].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar26 = 0;
    do {
      pcStack_12e0 = (code *)0x11a165;
      fdb_set(apfStack_12b8[lVar26],(fdb_doc *)aaStack_1238[uVar24].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar9 != lVar26);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0xf);
  pcStack_12e0 = (code *)0x11a189;
  fdb_commit(pfStack_12c8,'\x01');
  uVar24 = 0xf;
  do {
    pcStack_12e0 = (code *)0x11a1ab;
    sprintf(acStack_1098,"key%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a1c7;
    sprintf(acStack_1198,"meta%d",uVar24 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a1e3;
    sprintf(acStack_f98,"body%d",uVar24 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_1238 + uVar24);
    pcStack_12e0 = (code *)0x11a1f6;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x11a201;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1198);
    pcStack_12e0 = (code *)0x11a20c;
    sVar6 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x11a231;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_1098,sVar5,acStack_1198,(size_t)handle_00,
                   acStack_f98,sVar6);
    ppfVar14 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_12e0 = (code *)0x11a242;
      fdb_set(apfStack_12b8[(long)ppfVar14],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      ppfVar14 = (fdb_kvs_handle **)((long)ppfVar14 + 1);
    } while ((fdb_kvs_handle **)lVar9 != ppfVar14);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x14);
  pcStack_12e0 = (code *)0x11a263;
  fdb_commit(pfStack_12c8,'\0');
  pcVar12 = (code *)(ulong)uStack_12bc;
  if ((char)uStack_12bc != '\0') {
    aVar8.seqtree = (btree *)&fStack_1298.doc_count;
    handle_00.seqtree = (btree *)&fStack_1298.space_used;
    pcVar12 = (code *)(apfStack_12b8 + 4);
    pcVar31 = (char *)apfStack_12b8;
    do {
      ppfVar14 = (fdb_kvs_handle **)pcVar31;
      pcStack_12e0 = (code *)0x11a290;
      ppfVar30 = ppfVar14;
      fVar2 = fdb_rollback(ppfVar14,0);
      iVar4 = (int)ppfVar30;
      pcVar31 = (char *)ppfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a477;
      pfVar11 = *ppfVar14;
      pcStack_12e0 = (code *)0x11a2a6;
      fVar2 = fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)pcVar12);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a472;
      if (fStack_1298.last_seqnum != 0) {
        pcStack_12e0 = (code *)0x11a30f;
        rollback_to_zero_test();
      }
      if (fStack_1298.doc_count != 0) {
        pcStack_12e0 = (code *)0x11a319;
        rollback_to_zero_test();
      }
      if (fStack_1298.space_used != 0) {
        pcStack_12e0 = (code *)0x11a323;
        rollback_to_zero_test();
      }
      pfVar11 = *ppfVar14;
      pcStack_12e0 = (code *)0x11a2d6;
      fVar2 = fdb_get(pfVar11,(fdb_doc *)aaStack_1238[0].seqtree);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a481;
      pfVar11 = *ppfVar14;
      pcStack_12e0 = (code *)0x11a2ef;
      fVar2 = fdb_set(pfVar11,(fdb_doc *)aaStack_1238[0].seqtree);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a47c;
      pcVar31 = (char *)(ppfVar14 + 1);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
LAB_0011a3bb:
    pcStack_12e0 = (code *)0x11a3ca;
    pfVar21 = pfStack_12c8;
    fVar2 = fdb_commit(pfStack_12c8,'\x01');
    iVar4 = (int)pfVar21;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_12e0 = (code *)0x11a3dc;
      fdb_close(pfStack_12c8);
      lVar9 = 0;
      do {
        pcStack_12e0 = (code *)0x11a3eb;
        fdb_doc_free((fdb_doc *)aaStack_1238[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pcStack_12e0 = (code *)0x11a3f9;
      fdb_shutdown();
      pcStack_12e0 = (code *)0x11a3fe;
      memleak_end();
      pcVar31 = "single kv mode:";
      if ((char)uStack_12bc != '\0') {
        pcVar31 = "multiple kv mode:";
      }
      pcStack_12e0 = (code *)0x11a42e;
      sprintf(acStack_f98,"rollback to zero test %s",pcVar31);
      pcVar31 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      pcStack_12e0 = (code *)0x11a45b;
      fprintf(_stderr,pcVar31,acStack_f98);
      return;
    }
    goto LAB_0011a486;
  }
  ppfVar30 = apfStack_12b8;
  pcStack_12e0 = (code *)0x11a331;
  fVar2 = fdb_rollback(ppfVar30,0);
  iVar4 = (int)ppfVar30;
  pcVar31 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a48b;
  pcStack_12e0 = (code *)0x11a348;
  pfVar11 = apfStack_12b8[0];
  fVar2 = fdb_get_kvs_info(apfStack_12b8[0],(fdb_kvs_info *)(apfStack_12b8 + 4));
  iVar4 = (int)pfVar11;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a490;
  if (fStack_1298.last_seqnum != 0) {
    pcStack_12e0 = (code *)0x11a362;
    rollback_to_zero_test();
  }
  if (fStack_1298.doc_count != 0) {
    pcStack_12e0 = (code *)0x11a374;
    rollback_to_zero_test();
  }
  if (fStack_1298.space_used != 0) {
    pcStack_12e0 = (code *)0x11a386;
    rollback_to_zero_test();
  }
  pcStack_12e0 = (code *)0x11a398;
  pfVar11 = apfStack_12b8[0];
  fVar2 = fdb_get(apfStack_12b8[0],(fdb_doc *)aaStack_1238[0].seqtree);
  iVar4 = (int)pfVar11;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a495;
  pcStack_12e0 = (code *)0x11a3b3;
  fVar2 = fdb_set(apfStack_12b8[0],(fdb_doc *)aaStack_1238[0].seqtree);
  iVar4 = (int)apfStack_12b8[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a3bb;
  goto LAB_0011a49a;
LAB_0011aacb:
  pcStack_1608 = (code *)0x11aad0;
  rollback_to_zero_after_compact_test();
LAB_0011aad0:
  pcStack_1608 = (code *)0x11aad5;
  rollback_to_zero_after_compact_test();
LAB_0011aad5:
  pcStack_1608 = (code *)0x11aada;
  rollback_to_zero_after_compact_test();
LAB_0011aada:
  pcStack_1608 = (code *)0x11aadf;
  rollback_to_zero_after_compact_test();
  goto LAB_0011aadf;
LAB_0011b7d0:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e2;
  rollback_all_test();
  aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
LAB_0011b7e2:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f6;
  rollback_all_test();
  goto LAB_0011b7f6;
LAB_0011bfab:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_54b0 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_54b0 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_54b0 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_54b0 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_54b0 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_54b0 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_54b0 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_59b8 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_5b90 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_5b90 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011a472:
  pcStack_12e0 = (code *)0x11a477;
  rollback_to_zero_test();
LAB_0011a477:
  pcStack_12e0 = (code *)0x11a47c;
  rollback_to_zero_test();
LAB_0011a47c:
  pcStack_12e0 = (code *)0x11a481;
  rollback_to_zero_test();
LAB_0011a481:
  pcStack_12e0 = (code *)0x11a486;
  rollback_to_zero_test();
LAB_0011a486:
  pcStack_12e0 = (code *)0x11a48b;
  rollback_to_zero_test();
LAB_0011a48b:
  pcStack_12e0 = (code *)0x11a490;
  rollback_to_zero_test();
LAB_0011a490:
  pcStack_12e0 = (code *)0x11a495;
  rollback_to_zero_test();
LAB_0011a495:
  pcStack_12e0 = (code *)0x11a49a;
  rollback_to_zero_test();
LAB_0011a49a:
  pcStack_12e0 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_1608 = (code *)0x11a4c1;
  pfStack_1308 = (fdb_kvs_info *)pcVar12;
  aStack_1300 = aVar8;
  aStack_12f8 = handle_00;
  ppfStack_12f0 = ppfVar14;
  ppfStack_12e8 = (fdb_kvs_handle **)pcVar31;
  pcStack_12e0 = (code *)lVar9;
  gettimeofday(&tStack_14b0,(__timezone_ptr_t)0x0);
  pcStack_1608 = (code *)0x11a4cd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1608 = (code *)0x11a4dd;
  fdb_get_default_config();
  pcStack_1608 = (code *)0x11a4ea;
  fdb_get_default_kvs_config();
  fStack_1400.buffercache_size = 0;
  fStack_1400.wal_threshold = 0x400;
  fStack_1400.flags = 1;
  fStack_1400.compaction_threshold = '\0';
  pcStack_1608 = (code *)0x11a51d;
  fStack_1400.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_15f8,"./mvcc_test1",&fStack_1400);
  iStack_15ec = iVar4;
  if (iVar4 == 0) {
    pcStack_1608 = (code *)0x11a592;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_15f8,(fdb_kvs_handle **)auStack_15e0,
               (fdb_kvs_config *)(auStack_15e0 + 0xd0));
    pcVar31 = (char *)0x1;
  }
  else {
    ppfVar14 = (fdb_kvs_handle **)auStack_15e0;
    aVar8.seqtree = (btree *)(auStack_15e0 + 0xd0);
    uVar24 = 0;
    do {
      pcStack_1608 = (code *)0x11a554;
      sprintf(acStack_14f8,"kv%d",uVar24 & 0xffffffff);
      pcStack_1608 = (code *)0x11a567;
      fdb_kvs_open((fdb_file_handle *)pfStack_15f8,ppfVar14,acStack_14f8,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar24 = uVar24 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar24 != 4);
    pcVar31 = (char *)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar28 = (char *)0x0;
  pcVar12 = logCallbackFunc;
  pcVar27 = "rollback_to_zero_after_compact_test";
  do {
    pfVar11 = *(fdb_kvs_handle **)(auStack_15e0 + (long)pcVar28 * 8);
    pcStack_1608 = (code *)0x11a5b8;
    fVar2 = fdb_set_log_callback(pfVar11,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1608 = (code *)0x11aacb;
      rollback_to_zero_after_compact_test();
      goto LAB_0011aacb;
    }
    pcVar28 = pcVar28 + 1;
  } while (pcVar31 != pcVar28);
  uVar24 = 0;
  do {
    pcStack_1608 = (code *)0x11a5e7;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a5fd;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a616;
    sprintf(acStack_14f0,"body%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a629;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a639;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a649;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a66e;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar24].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a67f;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar24].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar31 != (char *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  pcStack_1608 = (code *)0x11a6a3;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
  uVar24 = 5;
  do {
    pcStack_1608 = (code *)0x11a6c5;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a6de;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a6fa;
    sprintf(acStack_14f0,"body%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a70d;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a718;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a723;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a745;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar24].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a755;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar24].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar31 != (char *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 10);
  pcStack_1608 = (code *)0x11a776;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\0');
  uVar24 = 10;
  do {
    pcStack_1608 = (code *)0x11a798;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a7b1;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a7cd;
    sprintf(acStack_14f0,"body%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a7e0;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a7eb;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a7f6;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a818;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar24].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a828;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar24].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar31 != (char *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0xf);
  pcStack_1608 = (code *)0x11a84c;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
  uVar24 = 0xf;
  do {
    pcStack_1608 = (code *)0x11a86e;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar24 & 0xffffffff);
    pcStack_1608 = (code *)0x11a887;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar24 & 0xffffffff);
    pcVar28 = acStack_14f0;
    pcStack_1608 = (code *)0x11a8a3;
    sprintf(pcVar28,"body%d",uVar24 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_14a0 + uVar24);
    pcStack_1608 = (code *)0x11a8b6;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a8c1;
    aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a8cc;
    sVar6 = strlen(pcVar28);
    pcStack_1608 = (code *)0x11a8ee;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,auStack_15e0 + 0x90,sVar5,auStack_15e0 + 0x50,
                   (size_t)aVar8,pcVar28,sVar6);
    pcVar12 = (code *)0x0;
    do {
      pcStack_1608 = (code *)0x11a8fe;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + (long)pcVar12 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar12 = (code *)((long)pcVar12 + 1);
    } while ((code *)pcVar31 != pcVar12);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x14);
  pcStack_1608 = (code *)0x11a91f;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\0');
  pfVar11 = (fdb_kvs_handle *)&pfStack_15e8;
  pcStack_1608 = (code *)0x11a938;
  fVar2 = fdb_open((fdb_file_handle **)pfVar11,"./mvcc_test1",&fStack_1400);
  pcVar27 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1608 = (code *)0x11a951;
    pfVar11 = pfStack_15e8;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_15e8,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aae4;
    pcStack_1608 = (code *)0x11a963;
    fdb_close((fdb_file_handle *)pfStack_15e8);
    pcVar28 = auStack_15e0 + 0x30;
    aVar8.seqtree = (btree *)(auStack_15e0 + 0x40);
    pcVar31 = (char *)(ulong)(uint)((int)pcVar31 << 3);
    pcVar27 = (char *)0x0;
    handle_00.seqtree = (btree *)(auStack_15e0 + 0x20);
    do {
      pcVar12 = (code *)(auStack_15e0 + (long)pcVar27);
      pcStack_1608 = (code *)0x11a98a;
      pfVar11 = (fdb_kvs_handle *)pcVar12;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar12,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad0;
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a99d;
      fVar2 = fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)handle_00.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aacb;
      if ((hbtrie *)auStack_15e0._40_8_ != (hbtrie *)0x0) {
        pcStack_1608 = (code *)0x11aa03;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_15e0._48_8_ != (btree *)0x0) {
        pcStack_1608 = (code *)0x11aa0d;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_15e0._64_8_ != (filemgr *)0x0) {
        pcStack_1608 = (code *)0x11aa17;
        rollback_to_zero_after_compact_test();
      }
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a9cd;
      fVar2 = fdb_get(pfVar11,(fdb_doc *)aaStack_14a0[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011aada;
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a9e6;
      fVar2 = fdb_set(pfVar11,(fdb_doc *)aaStack_14a0[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad5;
      pcVar27 = pcVar27 + 8;
    } while (pcVar31 != pcVar27);
    pcStack_1608 = (code *)0x11aa28;
    pfVar11 = pfStack_15f8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1608 = (code *)0x11aa3a;
      fdb_close((fdb_file_handle *)pfStack_15f8);
      lVar9 = 0;
      do {
        pcStack_1608 = (code *)0x11aa49;
        fdb_doc_free((fdb_doc *)aaStack_14a0[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pcStack_1608 = (code *)0x11aa57;
      fdb_shutdown();
      pcVar31 = "single kv mode:";
      if ((char)iStack_15ec != '\0') {
        pcVar31 = "multiple kv mode:";
      }
      pcStack_1608 = (code *)0x11aa87;
      sprintf(acStack_14f0,"rollback to zero after compact test %s",pcVar31);
      pcVar31 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      pcStack_1608 = (code *)0x11aab4;
      fprintf(_stderr,pcVar31,acStack_14f0);
      return;
    }
  }
  else {
LAB_0011aadf:
    pcStack_1608 = (code *)0x11aae4;
    rollback_to_zero_after_compact_test();
LAB_0011aae4:
    pcStack_1608 = (code *)0x11aae9;
    rollback_to_zero_after_compact_test();
  }
  pcStack_1608 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar11 & 0xffffffff);
  pcStack_2410 = (code *)0x11ab0d;
  pfStack_1630 = (fdb_kvs_handle *)pcVar12;
  aStack_1628 = aVar8;
  aStack_1620 = handle_00;
  pcStack_1618 = pcVar27;
  pcStack_1610 = pcVar28;
  pcStack_1608 = (code *)pcVar31;
  gettimeofday((timeval *)(auStack_23f8 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_2410 = (code *)0x11ab12;
  memleak_start();
  pcStack_2410 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2410 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &fStack_23b0;
  pcStack_2410 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  fStack_2090.buffercache_size = 0;
  fStack_2090.wal_threshold = 0x100;
  fStack_2090.flags = 1;
  fStack_2090.compaction_threshold = '\0';
  auStack_23f8._28_4_ = SUB84(pfVar11,0);
  fStack_2090.multi_kv_instances = SUB81(__s_00,0);
  ppfVar34 = (fdb_doc **)(auStack_23f8 + 8);
  pcStack_2410 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)ppfVar34,"./mvcc_test8",&fStack_2090);
  ptr_handle = (fdb_doc *)auStack_23f8;
  pcStack_2410 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)auStack_23f8._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_2410 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_23f8._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar9 = 0;
    uVar24 = 0;
    do {
      pcStack_2410 = (code *)0x11abc8;
      sprintf(acStack_2298,"key%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11abe1;
      sprintf(acStack_2198,"meta%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11abf7;
      sprintf((char *)afStack_2398,"body%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11ac0a;
      sVar5 = strlen(acStack_2298);
      pcStack_2410 = (code *)0x11ac1d;
      sVar6 = strlen(acStack_2198);
      pcStack_2410 = (code *)0x11ac2a;
      sVar7 = strlen((char *)afStack_2398);
      pcStack_2410 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1f98 + lVar9),acStack_2298,sVar5,acStack_2198,sVar6
                     ,afStack_2398,sVar7);
      pcStack_2410 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,(&pfStack_1f98)[uVar24]);
      uVar24 = uVar24 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar24 != 300);
    pcStack_2410 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)auStack_23f8._8_8_,'\0');
    lVar9 = 0;
    uVar24 = 0;
    do {
      auStack_23f8._40_8_ = (fdb_doc **)((long)&pfStack_1f98 + lVar9);
      pcStack_2410 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_1f98)[uVar24]);
      pcStack_2410 = (code *)0x11acbc;
      sprintf(acStack_2298,"key%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11acd8;
      sprintf(acStack_2198,"META%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11acf1;
      sprintf((char *)afStack_2398,"BODY%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11acf9;
      sVar5 = strlen(acStack_2298);
      pcStack_2410 = (code *)0x11ad04;
      sVar6 = strlen(acStack_2198);
      pcStack_2410 = (code *)0x11ad0f;
      sVar7 = strlen((char *)afStack_2398);
      pcStack_2410 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)auStack_23f8._40_8_,acStack_2298,sVar5,acStack_2198,sVar6,
                     afStack_2398,sVar7);
      pcStack_2410 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,(&pfStack_1f98)[uVar24]);
      uVar24 = uVar24 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar24 != 0x96);
    pcStack_2410 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)auStack_23f8._8_8_,'\0');
    uVar24 = 0x96;
    ppfVar34 = apfStack_1ae8;
    do {
      pcStack_2410 = (code *)0x11ad79;
      fdb_doc_free(*ppfVar34);
      pcStack_2410 = (code *)0x11ad95;
      sprintf(acStack_2298,"key%d",uVar24 & 0xffffffff);
      __s_00 = acStack_2198;
      pcStack_2410 = (code *)0x11adb1;
      sprintf(__s_00,"Meta%d",uVar24 & 0xffffffff);
      ptr_handle = afStack_2398;
      pcStack_2410 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar24 & 0xffffffff);
      pcStack_2410 = (code *)0x11add2;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2298);
      pcStack_2410 = (code *)0x11addd;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_2410 = (code *)0x11ade8;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_2410 = (code *)0x11ae08;
      fdb_doc_create(ppfVar34,acStack_2298,(size_t)aVar8,__s_00,(size_t)handle_00,ptr_handle,sVar5);
      pcStack_2410 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,*ppfVar34);
      uVar24 = uVar24 + 1;
      ppfVar34 = ppfVar34 + 1;
    } while (uVar24 != 300);
    pcStack_2410 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)auStack_23f8._8_8_,'\0');
    pcStack_2410 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_23f8,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_2410 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(auStack_23f8 + 0x10),(void *)psStack_1f90[4],*psStack_1f90,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_2410 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_23f8._0_8_,
                              (fdb_kvs_handle **)(auStack_23f8 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_2410 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_23f8._32_8_,(fdb_doc *)auStack_23f8._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(auStack_23f8._16_8_ + 0x40);
    ppfVar34 = (fdb_doc **)psStack_1f90[8];
    pcStack_2410 = (code *)0x11aecc;
    iVar4 = bcmp(config,ppfVar34,*(size_t *)(auStack_23f8._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)auStack_23f8._16_8_;
    if (iVar4 == 0) {
      if (*(fdb_seqnum_t *)(auStack_23f8._16_8_ + 0x28) != 0x12e) {
        pcStack_2410 = (code *)0x11aef0;
        rollback_to_wal_test();
        auStack_23f8._16_8_ = auStack_23f8._48_8_;
      }
      pcStack_2410 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)auStack_23f8._16_8_);
      pcStack_2410 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)auStack_23f8._32_8_);
      pcStack_2410 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)auStack_23f8._8_8_);
      lVar9 = 0;
      do {
        pcStack_2410 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_1f98)[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 300);
      pcStack_2410 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_2410 = (code *)0x11af34;
      memleak_end();
      pcVar31 = "single kv mode:";
      if (auStack_23f8[0x1c] != '\0') {
        pcVar31 = "multiple kv mode:";
      }
      pcStack_2410 = (code *)0x11af61;
      sprintf((char *)afStack_2398,"rollback to wal test %s",pcVar31);
      pcVar31 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      pcStack_2410 = (code *)0x11af8e;
      fprintf(_stderr,pcVar31,afStack_2398);
      return;
    }
  }
  else {
    pcStack_2410 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_2410 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_2410 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_2410 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_2410 = rollback_all_test;
  ppfVar22 = ppfVar34;
  rollback_to_wal_test();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe4;
  pfStack_2438 = ptr_handle;
  aStack_2430 = aVar8;
  aStack_2428 = handle_00;
  pfStack_2420 = config;
  ppfStack_2418 = ppfVar34;
  pcStack_2410 = (code *)__s_00;
  gettimeofday(&tStack_28e0,(__timezone_ptr_t)0x0);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe9;
  memleak_start();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b005;
  fdb_get_default_config();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_2530.buffercache_size._0_1_ = '\0';
  fStack_2530.buffercache_size._1_1_ = '\0';
  fStack_2530.buffercache_size._2_1_ = '\0';
  fStack_2530.buffercache_size._3_1_ = '\0';
  fStack_2530.buffercache_size._4_1_ = '\0';
  fStack_2530.buffercache_size._5_1_ = '\0';
  fStack_2530.buffercache_size._6_1_ = '\0';
  fStack_2530.buffercache_size._7_1_ = '\0';
  fStack_2530.wal_threshold._0_1_ = '\0';
  fStack_2530.wal_threshold._1_1_ = '\x04';
  fStack_2530.wal_threshold._2_1_ = '\0';
  fStack_2530.wal_threshold._3_1_ = '\0';
  fStack_2530.wal_threshold._4_1_ = '\0';
  fStack_2530.wal_threshold._5_1_ = '\0';
  fStack_2530.wal_threshold._6_1_ = '\0';
  fStack_2530.wal_threshold._7_1_ = '\0';
  fStack_2530.flags = 1;
  fStack_2530.compaction_threshold = 0;
  fStack_2530.block_reusing_threshold = 0;
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b045;
  fStack_2530.multi_kv_instances = (bool)(char)ppfVar22;
  fdb_open(&pfStack_2988,"./mvcc_test6",(fdb_config *)(acStack_2630 + 0x100));
  iStack_297c = (int)ppfVar22;
  if (iStack_297c == 0) {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_2988,(fdb_kvs_handle **)&aaStack_2960[0].seqtree,
               (fdb_kvs_config *)(acStack_2930 + 8));
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar13 = aaStack_2960;
    aVar8.seqtree = (btree *)(acStack_2930 + 8);
    uVar24 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b076;
      sprintf(acStack_2930,"kv%d",uVar24 & 0xffffffff);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b089;
      fdb_kvs_open(pfStack_2988,(fdb_kvs_handle **)&paVar13->seqtree,acStack_2930,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar24 = uVar24 + 1;
      paVar13 = paVar13 + 1;
    } while (uVar24 != 4);
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar28 = (char *)0x0;
  pcVar12 = logCallbackFunc;
  pcVar31 = "rollback_all_test";
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_2960[(long)pcVar28].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar28 = (char *)((hbtrie_func_readkey *)pcVar28 + 1);
  } while (aVar16.seqtree != (btree *)pcVar28);
  uVar24 = 0;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b106;
    sprintf(acStack_2730,"key%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b122;
    sprintf(acStack_2830,"meta%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13e;
    sprintf(acStack_2630,"body%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b151;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15c;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b167;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b18c;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar24].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b19c;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar24].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar16.seqtree != (btree *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
  fdb_commit(pfStack_2988,'\x01');
  uVar24 = 5;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e2;
    sprintf(acStack_2730,"key%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1fe;
    sprintf(acStack_2830,"meta%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
    sprintf(acStack_2630,"body%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b22d;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b238;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b243;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b268;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar24].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b279;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar24].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar16.seqtree != (btree *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 10);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29a;
  fdb_commit(pfStack_2988,'\0');
  uVar24 = 10;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2bc;
    sprintf(acStack_2730,"key%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d8;
    sprintf(acStack_2830,"meta%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
    sprintf(acStack_2630,"body%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b307;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b312;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b31d;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b342;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar24].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b353;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar24].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar16.seqtree != (btree *)lVar9);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0xf);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b377;
  fdb_commit(pfStack_2988,'\x01');
  uVar24 = 0xf;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b399;
    sprintf(acStack_2730,"key%d",uVar24 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3b5;
    sprintf(acStack_2830,"meta%d",uVar24 & 0xffffffff);
    aVar19.seqtree = (btree *)acStack_2630;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d1;
    sprintf((char *)aVar19.seqtree,"body%d",uVar24 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_28d0 + uVar24);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3e4;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ef;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3fa;
    sVar6 = strlen((char *)aVar19.seqtree);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41f;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_2730,sVar5,acStack_2830,(size_t)handle_00,
                   aVar19.seqtree,sVar6);
    pcVar28 = (char *)0x0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b430;
      fdb_set((fdb_kvs_handle *)aaStack_2960[(long)pcVar28].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      pcVar28 = (char *)((long)pcVar28 + 1);
    } while (aVar16.seqtree != (btree *)pcVar28);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x14);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b451;
  fdb_commit(pfStack_2988,'\0');
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_2988,(fdb_snapshot_info_t **)&pfStack_2970,(uint64_t *)&pfStack_2978);
  pcVar31 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_297c == '\0') {
      if (pfStack_2978 != (fdb_kvs_handle *)0x4) {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b49b;
        rollback_all_test();
      }
    }
    else if (pfStack_2978 != (fdb_kvs_handle *)0x8) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b489;
      rollback_all_test();
    }
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ae;
    fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
    if ((char)iStack_297c == '\0') {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
      aVar8.seqtree = (btree *)0x0;
      handle_00.seqtree = (btree *)&aStack_2968;
      pcVar31 = (char *)&aStack_2938;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b613;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,&fStack_2910);
        pcVar12 = (code *)aVar19;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
        if (fStack_2910.last_seqnum != 0xf) {
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c7;
          rollback_all_test();
        }
        if (fStack_2910.doc_count != 0xf) {
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6d9;
          rollback_all_test();
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b64b;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,pfStack_2838);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b673;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,
                           (aaStack_28d0[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_28d0[0].seqtree)->ksize,(void **)handle_00.seqtree,
                           (size_t *)pcVar31);
        pcVar12 = (code *)aStack_2968;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
        pcVar28 = (char *)(aaStack_28d0[0].seqtrie)->readkey;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69c;
        iVar4 = bcmp(pcVar28,aStack_2968.seqtree,(size_t)aStack_2938);
        if (iVar4 != 0) goto LAB_0011b7da;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
        free(pcVar12);
        aVar8.seqtree = (btree *)&(aVar8.seqtree)->vsize;
        aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar8.seqtree);
      aVar19.seqtree = (btree *)0x0;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6f2;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_2960[(long)aVar19].seqtree,
                        (fdb_doc *)aaStack_28d0[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
        aVar19.seqtree = (btree *)&(aVar19.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar19.seqtree);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b711;
      fVar2 = fdb_commit(pfStack_2988,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b723;
      fdb_close(pfStack_2988);
      lVar9 = 0;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b732;
        fdb_doc_free((fdb_doc *)aaStack_28d0[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74a;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_2970,(uint64_t)pfStack_2978);
      aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b757;
        fdb_shutdown();
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b75c;
        memleak_end();
        pcVar31 = "single kv mode:";
        if ((char)iStack_297c != '\0') {
          pcVar31 = "multiple kv mode:";
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b78c;
        sprintf(acStack_2630,"rollback all test %s",pcVar31);
        pcVar31 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar31 = "%s FAILED\n";
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7b9;
        fprintf(_stderr,pcVar31,acStack_2630);
        return;
      }
      goto LAB_0011b805;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
    aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ce;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_2960[(long)aVar19].seqtree);
      aVar19.seqtree = aVar19.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar19.seqtree);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4f2;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_2910,"./mvcc_test6",
                     (fdb_config *)(acStack_2630 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b518;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_2910.name,(fdb_kvs_handle **)&aStack_2968.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_2930 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b533;
    fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b546;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_2968.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b55b;
    fVar2 = fdb_close((fdb_file_handle *)fStack_2910.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b576;
      fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
      handle_00.seqtree = (btree *)aaStack_2960;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar31 = acStack_2930;
        pcVar28 = "rollback_all_test";
        aVar19.seqtree = (btree *)0x0;
        aVar8 = aVar16;
        do {
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5a7;
          sprintf(pcVar31,"kv%d",aVar19.seqtree);
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5bc;
          fVar2 = fdb_kvs_open(pfStack_2988,(fdb_kvs_handle **)handle_00.seqtree,pcVar31,
                               (fdb_kvs_config *)(acStack_2930 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d7;
          fVar2 = fdb_set_log_callback
                            ((fdb_kvs_handle *)
                             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             &(handle_00.seqtree)->ksize)->seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
          aVar19._0_4_ = aVar19._0_4_ + 1;
          aVar19._4_4_ = 0;
          handle_00.seqtree = (btree *)&(handle_00.seqtree)->root_bid;
          aVar8.seqtree = (btree *)((long)(aVar8.seqtree + -1) + 0x37);
        } while (aVar8.seqtree != (btree *)0x0);
        goto LAB_0011b5f4;
      }
      goto LAB_0011b7fb;
    }
  }
  else {
LAB_0011b7f6:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7fb;
    rollback_all_test();
LAB_0011b7fb:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b800;
    rollback_all_test();
LAB_0011b800:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b805;
    rollback_all_test();
LAB_0011b805:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80a;
    rollback_all_test();
LAB_0011b80a:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80f;
    rollback_all_test();
LAB_0011b80f:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b814;
    rollback_all_test();
LAB_0011b814:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b819;
    rollback_all_test();
LAB_0011b819:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b81e;
    rollback_all_test();
LAB_0011b81e:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b823;
    rollback_all_test();
  }
  aStack_2998.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b845;
  aStack_29c0 = aVar19;
  aStack_29b8 = aVar8;
  aStack_29b0 = handle_00;
  phStack_29a8 = (hbtrie_func_readkey *)pcVar28;
  aStack_29a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
  aStack_2998 = aVar16;
  gettimeofday(&tStack_2b18,(__timezone_ptr_t)0x0);
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b84a;
  memleak_start();
  puVar29 = &uStack_2b5c;
  uStack_2b5c = 0;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_2ab8;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b872;
  fdb_get_default_config();
  uStack_2a8a = 1;
  uStack_2a98 = 1;
  pcStack_2a60 = compaction_cb_count;
  uStack_2a58 = 0x20;
  uStack_2a80 = 1;
  aVar19.seqtree = (btree *)0x155054;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ac;
  puStack_2a50 = puVar29;
  fVar2 = fdb_open(&pfStack_2b68,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_2b58;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c1;
    fdb_get_default_kvs_config();
    fStack_2b08.custom_cmp_param = afStack_2b58[0].custom_cmp_param;
    fStack_2b08.create_if_missing = afStack_2b58[0].create_if_missing;
    fStack_2b08._1_7_ = afStack_2b58[0]._1_7_;
    fStack_2b08.custom_cmp = afStack_2b58[0].custom_cmp;
    aVar19.seqtree = (btree *)&aStack_2b70;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e6;
    fVar2 = fdb_kvs_open_default(pfStack_2b68,(fdb_kvs_handle **)aVar19.seqtree,&fStack_2b08);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    handle_00.seqtree = (btree *)0x155958;
    aVar8.seqtree = (btree *)0x0;
    do {
      pcVar31 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1555bd;
      aVar19.seqtree = (btree *)afStack_2b58;
      iVar4 = aVar8._0_4_;
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b91a;
      sprintf((char *)aVar19.seqtree,"%d",aVar8.seqtree);
      aVar16 = aStack_2b70;
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b927;
      sVar5 = strlen((char *)aVar19.seqtree);
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b93e;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar16.seqtree,aVar19.seqtree,sVar5,"value",5);
      aVar18.seqtree = handle_00.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        fconfig_00 = aVar16;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9a;
        auto_compaction_snapshots_test();
        handle_00 = aVar18;
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
LAB_0011bb9a:
        aVar18 = handle_00;
        handle_00 = aVar17;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb9;
        aVar19 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbe;
        auto_compaction_snapshots_test();
        aVar16 = handle_00;
        pcVar31 = (char *)doc_01;
LAB_0011bbbe:
        handle_00 = aVar18;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        puVar29 = (uint *)afStack_2b58;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      aVar16 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 10) * 10 == iVar4) {
        aVar19.seqtree = (btree *)0x0;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b96a;
        fVar2 = fdb_commit(pfStack_2b68,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      fconfig_00 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 100) * 100 == iVar4) {
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b99b;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_2b70.seqtree,&fStack_2ae8);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_2ae8.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2b70.seqtree,&pfStack_2b78,
                                  fStack_2ae8.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e3;
        fdb_doc_create((fdb_doc **)&aStack_2b80.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2b80.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_2b78,(fdb_doc *)aStack_2b80.seqtree);
        aVar18 = aStack_2b80;
        doc_01.seqtree = (btree *)pcVar31;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar31 = (char *)(aStack_2b80.seqtrie)->aux;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba17;
        sVar5 = strlen(&afStack_2b58[0].create_if_missing);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba25;
        iVar3 = bcmp(pcVar31,afStack_2b58,sVar5);
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
        if (iVar3 != 0) goto LAB_0011bb9f;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba35;
        fdb_doc_free((fdb_doc *)aVar18.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_2b78);
        aVar17.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        aVar19.seqtree = (btree *)&pfStack_2b78;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5d;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2b70.seqtree,
                                  (fdb_kvs_handle **)aVar19.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba83;
        fdb_doc_create((fdb_doc **)&aStack_2b80.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2b80.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba96;
        aVar19 = aStack_2b80;
        fVar2 = fdb_get_byseq(pfStack_2b78,(fdb_doc *)aStack_2b80.seqtree);
        doc_01 = aStack_2b80;
        aVar16.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2b80.seqtrie)->aux;
        aVar19.seqtree = (btree *)afStack_2b58;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
        sVar5 = strlen((char *)aVar19.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bac2;
        iVar3 = bcmp(fconfig_00.seqtree,aVar19.seqtree,sVar5);
        if (iVar3 != 0) goto LAB_0011bbac;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_01.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_2b78);
        pcVar31 = (char *)0xcccccccd;
        aVar16.seqtree = (btree *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      puVar29 = (uint *)afStack_2b58;
      pcVar31 = (char *)0xcccccccd;
      aVar16.seqtree = (btree *)0x1555bd;
      aVar8._0_4_ = iVar4 + 1;
      aVar8._4_4_ = 0;
    } while (aVar8._0_4_ != 100000);
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb0e;
    fVar2 = fdb_close(pfStack_2b68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb28;
      memleak_end();
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb42;
      sprintf(&afStack_2b58[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_2b5c);
      pcVar31 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb6f;
      fprintf(_stderr,pcVar31,afStack_2b58);
      return;
    }
  }
  else {
LAB_0011bbc8:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  aStack_2b90.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar18.seqtree = aVar19.seqtree & 0xffffffff;
  __tv = &tStack_2ba8;
  aStack_2bb8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbf3;
  aStack_2b98 = fconfig_00;
  aStack_2b90 = aVar16;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar19._0_4_ == 0x20) {
    if (extraout_RDX_00 == 0) {
      *(int *)&(aStack_2b80.seqtree)->ksize = *(int *)&(aStack_2b80.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_2bb8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc12;
    compaction_cb_count();
  }
  aStack_2bb8.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc37;
  aStack_2bd8 = aVar8;
  aStack_2bd0 = handle_00;
  puStack_2bc8 = puVar29;
  aStack_2bc0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
  aStack_2bb8.seqtree = aVar18.seqtree;
  gettimeofday((timeval *)(acStack_2e0f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3c;
  memleak_start();
  uStack_2e1c = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc66;
    fdb_get_default_config();
    fconfig_02 = &fStack_2cd8;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc7e;
    memcpy(fconfig_02,auStack_2dd0,0xf8);
    fStack_2cd8.block_reusing_threshold = 0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc9d;
    fVar2 = fdb_open(&pfStack_2e28,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb2;
      fdb_get_default_kvs_config();
      uStack_2de8 = uStack_2dc0;
      pcStack_2df8 = (char *)auStack_2dd0._0_8_;
      pfStack_2df0 = (fdb_config *)auStack_2dd0._8_8_;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_2e28,(fdb_kvs_handle **)&aStack_2e30.seqtree,
                         (fdb_kvs_config *)(acStack_2e0f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      handle_00._0_1_ = 1;
      __tv = (timeval *)0x1;
      uVar25 = 0;
      do {
        aVar18._0_4_ = uVar25 + 1;
        aVar18._4_4_ = 0;
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd03;
        sprintf(acStack_2e0f,"%d",aVar18.seqtree);
        aVar8 = aStack_2e30;
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd10;
        sVar5 = strlen(acStack_2e0f);
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2b;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar8.seqtree,acStack_2e0f,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar25) {
          handle_00.seqtree = handle_00.seqtree ^ 1;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd66;
          fdb_commit(pfStack_2e28,handle_00._0_1_);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar25 = aVar18._0_4_;
      } while (aVar18._0_4_ < 10000);
      aVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd8b;
      fdb_commit(pfStack_2e28,'\x01');
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd9a;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e30.seqtree,(fdb_kvs_info *)auStack_2dd0);
      __tv = (timeval *)(auStack_2dd0 + 8);
      if ((fdb_config *)auStack_2dd0._8_8_ != (fdb_config *)0x2710) {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
        rollback_during_ops_test();
      }
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc8;
      pthread_create(&pStack_2e18,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_2e1c);
      fconfig_02 = (fdb_config *)0x155958;
      pcVar31 = acStack_2e0f;
      aVar8.seqtree = (btree *)0x1555bd;
      do {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdea;
        sprintf(pcVar31,"%d",aVar18.seqtree);
        handle_00 = aStack_2e30;
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf7;
        sVar5 = strlen(pcVar31);
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be0e;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar31,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be2a;
          fVar2 = fdb_commit(pfStack_2e28,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        aVar18._0_4_ = aVar18._0_4_ + 1;
        aVar18._4_4_ = 0;
      } while (aVar18._0_4_ != 0x2711);
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be50;
      pthread_join(pStack_2e18,(void **)(acStack_2e0f + 0xf));
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be73;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e30.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be8a;
      fVar2 = fdb_commit(pfStack_2e28,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bea4;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e30.seqtree,(fdb_kvs_info *)auStack_2dd0);
      fconfig_02 = (fdb_config *)auStack_2dd0._8_8_;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11becb;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e30.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bef6;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e30.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf0d;
      fVar2 = fdb_commit(pfStack_2e28,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf22;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2e30.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf3c;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e30.seqtree,(fdb_kvs_info *)auStack_2dd0);
        if ((fdb_config *)auStack_2dd0._8_8_ != fconfig_02) {
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf4d;
          rollback_during_ops_test();
        }
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf57;
        fdb_close(pfStack_2e28);
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf5c;
        fdb_shutdown();
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf61;
        memleak_end();
        pcVar31 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar31 = "%s FAILED\n";
        }
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf92;
        fprintf(_stderr,pcVar31,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_2dd0;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0fd;
      rollback_during_ops_test();
    }
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_02 = (fdb_config *)auStack_2dd0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc2;
    fdb_get_default_config();
    pcVar31 = (char *)&fStack_2cd8;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfda;
    memcpy(pcVar31,fconfig_02,0xf8);
    fStack_2cd8.block_reusing_threshold = 0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff9;
    fVar2 = fdb_open(&pfStack_2e28,"mvcc_test1",(fdb_config *)pcVar31);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_02 = (fdb_config *)auStack_2dd0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c00e;
    fdb_get_default_kvs_config();
    uStack_2de8 = uStack_2dc0;
    pcStack_2df8 = (char *)auStack_2dd0._0_8_;
    pfStack_2df0 = (fdb_config *)auStack_2dd0._8_8_;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c031;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2e28,(fdb_kvs_handle **)&aStack_2e30.seqtree,
                       (fdb_kvs_config *)(acStack_2e0f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        handle_00.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x155958;
        pcVar31 = acStack_2e0f;
        aVar8.seqtree = (btree *)0x1555bd;
        do {
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c06e;
          sprintf(pcVar31,"%d",(ulong)__tv & 0xffffffff);
          aVar18 = aStack_2e30;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07b;
          sVar5 = strlen(pcVar31);
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c092;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar18.seqtree,pcVar31,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0b8;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2e30.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0d3;
      fdb_close(pfStack_2e28);
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  aStack_2e40.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c132;
  ptStack_2e60 = __tv;
  aStack_2e58 = aVar8;
  aStack_2e50 = handle_00;
  pfStack_2e48 = fconfig_02;
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
  gettimeofday((timeval *)(auStack_2fbf + 0xf),(__timezone_ptr_t)0x0);
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c137;
  memleak_start();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_2f58;
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
  fdb_get_default_config();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c167;
  fVar2 = fdb_open(&pfStack_2fe0,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_2fa0 + 0x30);
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17f;
    fdb_get_default_kvs_config();
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c191;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2fe0,(fdb_kvs_handle **)&aStack_2fe8.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x155958;
    pcVar31 = auStack_2fbf;
    aVar8.seqtree = (btree *)0x1555bd;
    do {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c0;
      sprintf(pcVar31,"%d",fconfig_01);
      handle_00 = aStack_2fe8;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1cd;
      sVar5 = strlen(pcVar31);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e4;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar31,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar25 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar25;
    } while (uVar25 != 4);
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1ff;
    fdb_commit(pfStack_2fe0,'\0');
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c222;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2fe8.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c24d;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2fe8.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c264;
    fVar2 = fdb_commit(pfStack_2fe0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27b;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2fe8.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_01 = (fdb_config *)auStack_2fa0;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c295;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2fe8.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_2fa0._8_8_ != 3) {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2bc;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2fe8.seqtree,&pfStack_2fc8,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2e4;
    fdb_iterator_init(pfStack_2fc8,&pfStack_2fd8,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_2fd0;
    pfStack_2fd0 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_2fd8,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c315;
      fdb_doc_free(pfStack_2fd0);
      pfStack_2fd0 = (fdb_doc *)0x0;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_2fd8);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c343;
      fdb_iterator_close(pfStack_2fd8);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c34d;
      fdb_kvs_close(pfStack_2fc8);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c357;
      fdb_close(pfStack_2fe0);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c35c;
      fdb_shutdown();
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c361;
      memleak_end();
      pcVar31 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c392;
      fprintf(_stderr,pcVar31,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  aStack_2ff8.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_54b0 = (code *)0x11c3f2;
  pfStack_3020 = fconfig_01;
  aStack_3018 = aVar8;
  aStack_3010 = handle_00;
  pfStack_3008 = fconfig_02;
  aStack_3000 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar31;
  aStack_2ff8 = aVar18;
  gettimeofday(&tStack_5438,(__timezone_ptr_t)0x0);
  pcStack_54b0 = (code *)0x11c3f7;
  memleak_start();
  pcStack_54b0 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_54b0 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_54b0 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_5320.wal_threshold = 0x400;
  fStack_5320.compaction_mode = 0;
  fStack_5320.durability_opt = 2;
  pfVar11 = (fdb_kvs_handle *)(apfStack_5128 + 0x20);
  ppfVar14 = apfStack_5428;
  pcVar31 = "kvs%d";
  uVar24 = 0;
  ppfVar30 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_54b0 = (code *)0x11c45d;
    sprintf((char *)ppfVar14,"mvcc_test%d",(ulong)ppfVar30 & 0xffffffff);
    pcVar28 = (char *)(apfStack_5498 + (long)ppfVar30);
    pcStack_54b0 = (code *)0x11c478;
    ppfVar23 = (fdb_kvs_handle **)pcVar28;
    fVar2 = fdb_open((fdb_file_handle **)pcVar28,(char *)ppfVar14,
                     (fdb_config *)(apfStack_5428 + 0x21));
    iVar4 = (int)ppfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar23 = (fdb_kvs_handle **)0x0;
    ppfStack_54a8 = ppfVar30;
    pfStack_54a0 = pfVar11;
    do {
      ppfVar30 = ppfVar23;
      pcStack_54b0 = (code *)0x11c49d;
      sprintf((char *)ppfVar14,"kvs%d",(ulong)(uint)((int)ppfVar30 + (int)uVar24));
      pfVar35 = *(fdb_kvs_handle **)pcVar28;
      pcStack_54b0 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar35,(fdb_kvs_handle **)pfVar11,(char *)ppfVar14,
                           (fdb_kvs_config *)(apfStack_5498 + 9));
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_54b0 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
      ppfVar23 = (fdb_kvs_handle **)((long)ppfVar30 + 1);
    } while ((char *)((long)ppfVar30 + 1) != (char *)0x80);
    ppfVar30 = (fdb_kvs_handle **)((long)ppfStack_54a8 + 1);
    uVar24 = uVar24 + 0x80;
    pfVar11 = (fdb_kvs_handle *)&pfStack_54a0[1].bub_ctx.space_used;
  } while (ppfVar30 != (fdb_kvs_handle **)0x8);
  ppfVar30 = apfStack_5428 + 0x40;
  ppfVar14 = apfStack_5128;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    uVar24 = 0;
    do {
      pcStack_54b0 = (code *)0x11c511;
      sprintf((char *)ppfVar30,"key%08d",uVar24);
      pcStack_54b0 = (code *)0x11c524;
      sprintf((char *)ppfVar14,"value%08d",uVar24);
      pcVar31 = (char *)apfStack_5128[(long)&pfVar11->op_stats];
      pcStack_54b0 = (code *)0x11c534;
      sVar5 = strlen((char *)ppfVar30);
      pcVar28 = (char *)(sVar5 + 1);
      pcStack_54b0 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar14);
      pcStack_54b0 = (code *)0x11c555;
      pfVar35 = (fdb_kvs_handle *)pcVar31;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar31,ppfVar30,(size_t)pcVar28,ppfVar14,sVar5 + 1);
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar25 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar25;
    } while (uVar25 != 10);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar35 = apfStack_5498[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\0');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_54b0 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\x01');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  pcVar28 = "key%08d";
  ppfVar30 = apfStack_5428 + 0x40;
  ppfVar14 = (fdb_kvs_handle **)0x0;
  do {
    uVar24 = 0;
    do {
      pcStack_54b0 = (code *)0x11c5ca;
      sprintf((char *)ppfVar30,"key%08d",uVar24);
      pfVar11 = apfStack_5128[(long)(ppfVar14 + 4)];
      pcStack_54b0 = (code *)0x11c5da;
      sVar5 = strlen((char *)ppfVar30);
      pcStack_54b0 = (code *)0x11c5e9;
      pfVar35 = pfVar11;
      fVar2 = fdb_del_kv(pfVar11,ppfVar30,sVar5 + 1);
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar25 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar25;
    } while (uVar25 != 10);
    ppfVar14 = (fdb_kvs_handle **)((long)ppfVar14 + 1);
  } while (ppfVar14 != (fdb_kvs_handle **)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar35 = apfStack_5498[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\0');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_54b0 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\x01');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  ppfVar30 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar28 = (char *)(apfStack_5128 + 0x20);
  do {
    pcStack_54b0 = (code *)0x11c657;
    ppfVar23 = (fdb_kvs_handle **)pcVar28;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar28,10);
    iVar4 = (int)ppfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    ppfVar30 = ppfVar30 + 8;
    pcVar28 = (char *)((long)pcVar28 + 0x200);
  } while (ppfVar30 < (fdb_kvs_handle **)0x3c0);
  ppfVar14 = apfStack_5498;
  pcVar28 = "kvs%d";
  ppfVar30 = apfStack_5428;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfVar35 = apfStack_5128[(long)&pfVar11->op_stats];
    pcStack_54b0 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar35);
    iVar4 = (int)pfVar35;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_54b0 = (code *)0x11c6af;
    sprintf((char *)ppfVar30,"kvs%d",(ulong)pfVar11 & 0xffffffff);
    pfVar35 = *ppfVar14;
    pcStack_54b0 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar35,(char *)ppfVar30);
    iVar4 = (int)pfVar35;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->config).wal_threshold;
    ppfVar14 = ppfVar14 + 1;
  } while (pfVar11 != (fdb_kvs_handle *)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar35 = apfStack_5498[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\0');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_54b0 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar35,'\x01');
      iVar4 = (int)pfVar35;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  pcVar28 = "mvcc_test_compact%d";
  ppfVar30 = apfStack_5428;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_54b0 = (code *)0x11c72d;
    sprintf((char *)ppfVar30,"mvcc_test_compact%d",(ulong)pfVar11 & 0xffffffff);
    pfVar35 = apfStack_5498[(long)pfVar11];
    pcStack_54b0 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar35,(char *)ppfVar30);
    iVar4 = (int)pfVar35;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x8);
  pcVar28 = (char *)0x0;
  pcStack_54b0 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar35 = apfStack_5498[(long)pcVar28];
    pcStack_54b0 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar35);
    iVar4 = (int)pfVar35;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar28 = (char *)((long)pcVar28 + 1);
    if (pcVar28 == (char *)0x8) {
      pcStack_54b0 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_54b0 = (code *)0x11c775;
      memleak_end();
      pcVar31 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      pcStack_54b0 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar31,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_54b0 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_54b0 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_54b0 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_54b0 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_54b0 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_54b0 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_54b0 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_59b8 = (code *)0x11c825;
  ppfStack_54d8 = (fdb_kvs_handle **)pcVar28;
  ppfStack_54d0 = ppfVar14;
  pfStack_54c8 = (fdb_kvs_handle *)pcVar31;
  ppfStack_54c0 = ppfVar30;
  pfStack_54b8 = pfVar11;
  pcStack_54b0 = (code *)uVar24;
  gettimeofday(&tStack_5930,(__timezone_ptr_t)0x0);
  pcStack_59b8 = (code *)0x11c82a;
  memleak_start();
  pcStack_59b8 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_59b8 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_55d0.flags = 1;
  fStack_55d0.block_reusing_threshold = 0;
  fStack_55d0.seqtree_opt = 0;
  pcStack_59b8 = (code *)0x11c86a;
  fStack_55d0.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_59b8 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_59a0,"./mvcc_test1",(fdb_config *)(acStack_56d0 + 0x100));
  iStack_597c = iVar4;
  if (iVar4 == 0) {
    pcStack_59b8 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_59a0,apfStack_5970,&fStack_5950);
    pcVar31 = (char *)0x1;
  }
  else {
    ppfVar14 = apfStack_5970;
    uVar24 = 0;
    do {
      pcStack_59b8 = (code *)0x11c8af;
      sprintf(acStack_5938,"kv%d",uVar24 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_59a0,ppfVar14,acStack_5938,&fStack_5950);
      uVar24 = uVar24 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar24 != 3);
    pcVar31 = (char *)0x3;
  }
  uStack_59a4 = 0;
  do {
    uVar24 = 0;
    do {
      pcStack_59b8 = (code *)0x11c916;
      sprintf(acStack_57d0,"key%d",uVar24 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c937;
      sprintf(acStack_5920,"meta-%d-%d",(ulong)uStack_59a4,uVar24 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c956;
      sprintf(acStack_56d0,"body-%d-%d",(ulong)uStack_59a4,uVar24 & 0xffffffff);
      doc = (btree *)(&bStack_5820.ksize + uVar24 * 8);
      pcStack_59b8 = (code *)0x11c969;
      sVar5 = strlen(acStack_57d0);
      pcStack_59b8 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_5920);
      pcStack_59b8 = (code *)0x11c984;
      sVar6 = strlen(acStack_56d0);
      pcStack_59b8 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_57d0,sVar5,acStack_5920,metalen._M_i,acStack_56d0,sVar6
                    );
      pfVar11 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_59b8 = (code *)0x11c9ba;
        fdb_set(apfStack_5970[(long)pfVar11],*(fdb_doc **)doc);
        pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 1);
      } while ((fdb_kvs_handle *)pcVar31 != pfVar11);
      pcStack_59b8 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_5820.ksize + uVar24 * 8));
      uVar24 = uVar24 + 1;
    } while (uVar24 != 10);
    pcStack_59b8 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_59a0,~(byte)uStack_59a4 & 1);
    uStack_59a4 = uStack_59a4 + 1;
    pcVar28 = (char *)(ulong)uStack_59a4;
  } while (uStack_59a4 != 5);
  pcStack_59b8 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_59a0,&pfStack_5988,&uStack_5958);
  pfVar35 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_59b8 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_5970,(pfStack_5988[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_5998 = (fdb_kvs_handle *)0x0;
    pcVar28 = acStack_56d0;
    pfVar35 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_59b8 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_5970[(long)pfVar35],&pfStack_5978,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_59b8 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_59b8 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_59b8 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_59b8 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_59b8 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_5978,&pfStack_5990,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_59b8 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_59b8 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_5990,(fdb_doc **)&pfStack_5998);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_59b8 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_59b8 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_59b8 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_59b8 = (code *)0x11cacd;
        sprintf(acStack_57d0,"key%d",metalen._M_i);
        if (pfVar35 == (fdb_kvs_handle *)0x0) {
          pcStack_59b8 = (code *)0x11cb1c;
          sprintf(acStack_5920,"meta-1-%d",metalen._M_i);
          pcStack_59b8 = (code *)0x11cb30;
          sprintf(pcVar28,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_59b8 = (code *)0x11caf0;
          sprintf(acStack_5920,"meta-%d-%d",4,metalen._M_i);
          pcStack_59b8 = (code *)0x11cb09;
          sprintf(pcVar28,"body-%d-%d",4);
        }
        pfVar11 = pfStack_5998;
        doc = (btree *)pfStack_5998->op_stats;
        pcStack_59b8 = (code *)0x11cb4c;
        iVar4 = bcmp(doc,acStack_57d0,*(size_t *)&pfStack_5998->kvs_config);
        if (iVar4 != 0) {
          pcStack_59b8 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar11->staletree;
        pcStack_59b8 = (code *)0x11cb6c;
        iVar4 = bcmp(doc,acStack_5920,(size_t)(pfVar11->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cce6;
        doc = (pfVar11->field_6).seqtree;
        pcStack_59b8 = (code *)0x11cb87;
        iVar4 = bcmp(doc,pcVar28,(size_t)(pfVar11->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011ccd6;
        pcStack_59b8 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_5998 = (fdb_kvs_handle *)0x0;
        uVar25 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar25;
        pcStack_59b8 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_5990);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar25 != 10) goto LAB_0011cd00;
      pcStack_59b8 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_5990);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_59b8 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_5978);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar35 = (fdb_kvs_handle *)&(pfVar35->kvs_config).field_0x1;
    } while (pfVar35 != (fdb_kvs_handle *)pcVar31);
    pcVar28 = (char *)0x0;
    do {
      pcStack_59b8 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_5970[(long)pcVar28]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar28 = pcVar28 + 1;
    } while (pcVar31 != pcVar28);
    pcStack_59b8 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_59a0,pfStack_5988[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_59b8 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_5988,uStack_5958);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_59b8 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_59a0);
      pcStack_59b8 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_59b8 = (code *)0x11cc52;
      memleak_end();
      pcVar31 = "single kv mode:";
      if ((char)iStack_597c != '\0') {
        pcVar31 = "multiple kv mode:";
      }
      pcStack_59b8 = (code *)0x11cc82;
      sprintf(acStack_56d0,"rollback without seqtree in %s",pcVar31);
      pcVar31 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar31 = "%s FAILED\n";
      }
      pcStack_59b8 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar31,acStack_56d0);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_59b8 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_59b8 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_59b8 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_59b8 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cd45;
  pcStack_59e0 = pcVar28;
  aStack_59d8.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_59d0 = doc;
  pfStack_59c8 = pfVar11;
  pfStack_59c0 = pfVar35;
  pcStack_59b8 = (code *)pcVar31;
  gettimeofday(&tStack_5b30,(__timezone_ptr_t)0x0);
  pfStack_5b90 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar31 = auStack_5b20 + 0x48;
  pfStack_5b90 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_5b88,"./mvcc_test2",(fdb_config *)pcVar31);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar31 = auStack_5b20;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_5b38 = (btreeblk_handle *)auStack_5b20._16_8_;
    pfStack_5b48 = (filemgr *)auStack_5b20._0_8_;
    pdStack_5b40 = (docio_handle *)auStack_5b20._8_8_;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_5b88,&pfStack_5b80,(fdb_kvs_config *)&pfStack_5b48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar31 = "key%d";
    pfVar11 = (fdb_kvs_handle *)acStack_5b77;
    pfVar35 = (fdb_kvs_handle *)0x1555bd;
    uVar24 = 0;
    do {
      pfStack_5b90 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar11,"key%d",uVar24);
      handle = pfStack_5b80;
      pfStack_5b90 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar11);
      pfStack_5b90 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(handle,pfVar11,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5b90 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar25 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar25;
    } while (uVar25 != 10);
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_5b88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_5b88,"./mvcc_test3");
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar31 = "key%d";
    pfVar11 = (fdb_kvs_handle *)acStack_5b77;
    uVar25 = 0;
    do {
      pfStack_5b90 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar11,"key%d",(ulong)uVar25);
      pfVar35 = pfStack_5b80;
      pfStack_5b90 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar11);
      pfStack_5b90 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar35,pfVar11,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar25 = uVar25 + 1;
    } while (uVar25 != 10);
    pfStack_5b90 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_5b88,(fdb_file_info *)auStack_5b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar31 = (char *)((ulong)auStack_5b20._40_8_ / (ulong)uStack_5ad4);
    pfStack_5b90 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_5b88);
    pfStack_5b90 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf00;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_5ad4 * (long)pcVar31,
                       (ulong)((uStack_5ad4 >> 2) + uStack_5ad4 * 2));
    if (iVar4 < 0) goto LAB_0011d0d2;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf2a;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar31 * 4 + 8) * (ulong)uStack_5ad4,
                       (ulong)(uStack_5ad4 >> 2));
    if (iVar4 < 0) goto LAB_0011d0d7;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_5b88,"./mvcc_test3",(fdb_config *)(auStack_5b20 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar31 = (char *)&pfStack_5b68;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_5b38 = pbStack_5b58;
    pfStack_5b48 = pfStack_5b68;
    pdStack_5b40 = pdStack_5b60;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_5b88,&pfStack_5b80,(fdb_kvs_config *)&pfStack_5b48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar25 = 0;
      do {
        pfStack_5b90 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_5b77,"key%d",(ulong)uVar25);
        pfVar35 = pfStack_5b80;
        pfStack_5b90 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_5b77);
        pfStack_5b90 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar35,acStack_5b77,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar25 = uVar25 + 1;
      } while (uVar25 != 10);
      pfStack_5b90 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_5b88);
      pfVar35 = (fdb_kvs_handle *)&pfStack_5b68;
      uVar25 = 0;
      while( true ) {
        pfStack_5b90 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_5b77,"key%d",(ulong)uVar25);
        pfVar11 = pfStack_5b80;
        pfStack_5b90 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_5b77);
        pfStack_5b90 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar11,acStack_5b77,sVar5,(void **)pfVar35,&sStack_5b50);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5b90 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_5b68);
        uVar25 = uVar25 + 1;
        if (uVar25 == 10) {
          pfStack_5b90 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_5b88);
          pfStack_5b90 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_5b90 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar31 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar31 = "%s FAILED\n";
          }
          pfStack_5b90 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar31,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar11 = (fdb_kvs_handle *)acStack_5b77;
      pcVar31 = "key%d";
      pfStack_5b90 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_5b90 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_5b90 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_5ba0 = (fdb_config *)pcVar31;
  pfStack_5b98 = pfVar11;
  pfStack_5b90 = pfVar35;
  gettimeofday(&tStack_5cc0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_5cd0 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_5ce0,"./mvcc_test1",&fStack_5c98);
  fdb_kvs_open_default(pfStack_5ce0,&pfStack_5cc8,&fStack_5cb0);
  fdb_kvs_open(pfStack_5ce0,&pfStack_5ce8,"kv",&fStack_5cb0);
  fVar2 = fdb_set_kv(pfStack_5ce8,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_5ce8,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_5ce0,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_5ce8,&pfStack_5cf0,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_5cf0,&pfStack_5cd8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_5cf0);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_5ce8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_5ce0,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_5cd8,&pfStack_5cd0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_5cd0);
    fVar2 = fdb_iterator_close(pfStack_5cd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_5cf0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_5cc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_5ce0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar31 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar31 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar31,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_prior_to_ops(bool walflush)
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int expected_doc_count = 0;
    int rb_seqnum;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL, *vdoc;
    fdb_status status;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; // retain deletes until compaction

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    if(walflush){
        fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);
    } else {
        fdb_kvs_open(dbfile, &mirror_kv1, "mirror", &kvs_config);
    }

    // set n docs
    for(i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set(mirror_kv1, doc[i]);
        expected_doc_count++;
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // delete subset of recently loaded docs
    for(i=0;i<n/2;++i){
        fdb_del(kv1, doc[i]);
        fdb_del(mirror_kv1, doc[i]);
        expected_doc_count--;
        fdb_doc_free(doc[i]);
    }

    for(i=n/2;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // commit and save seqnum
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    rb_seqnum = info.last_seqnum;

    for (j=0;j<100;++j){
        // load some more docs but stop mirroring
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%d", n+i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                NULL, 0, NULL, 0);
            fdb_set(kv1, doc[i]);
            if( n%2 == 0){
                fdb_del(kv1, doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
    }

    // commit wal or normal
    if(walflush){
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }

    // rollback
    status = fdb_rollback(&kv1, rb_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    fdb_get_kvs_info(mirror_kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get_metaonly(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_create(&vdoc, rdoc->key, rdoc->keylen,
                              rdoc->meta, rdoc->metalen,
                              rdoc->body, rdoc->bodylen);
        status = fdb_get(kv1, vdoc);
        if (rdoc->deleted){
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        } else {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
        fdb_doc_free(vdoc);
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(it);
    fdb_kvs_close(mirror_kv1);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    sprintf(bodybuf, "rollback prior to ops test %s",
            walflush ? "commit with wal flush:" : "normal commit:");
    TEST_RESULT(bodybuf);
}